

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

Wlc_Ntk_t * Wlc_NtkMemAbstractTest(Wlc_Ntk_t *p)

{
  char cVar1;
  void *__ptr;
  Vec_Int_t *vMemObjs;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar2;
  Vec_Int_t *vNodeFrames;
  int *piVar3;
  Wlc_Ntk_t *pWVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int Count;
  ulong uVar10;
  int iFirstMemCi;
  int iFirstCi;
  int iFirstMemPi;
  Vec_Int_t *local_38;
  
  vMemObjs = Wlc_NtkCollectMemory(p,0);
  local_38 = Wlc_NtkCollectMemFanins(p,vMemObjs);
  p_00 = (Vec_Wec_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  pVVar2 = (Vec_Int_t *)calloc(100,0x10);
  p_00->pArray = pVVar2;
  vNodeFrames = (Vec_Int_t *)malloc(0x10);
  vNodeFrames->nCap = 100;
  vNodeFrames->nSize = 0;
  piVar3 = (int *)malloc(400);
  vNodeFrames->pArray = piVar3;
  pVVar2 = Vec_WecPushLevel(p_00);
  Vec_IntPush(pVVar2,0x5800);
  Vec_IntPush(pVVar2,0x5000);
  Vec_IntPush(pVVar2,0x4000);
  Vec_IntPush(pVVar2,0x4800);
  Wlc_NtkAbsAddToNodeFrames(vNodeFrames,pVVar2);
  pWVar4 = Wlc_NtkAbstractMemory
                     (p,vMemObjs,(Vec_Int_t *)0x0,&iFirstMemPi,&iFirstCi,&iFirstMemCi,p_00,
                      vNodeFrames);
  iVar6 = p_00->nCap;
  pVVar2 = p_00->pArray;
  if (iVar6 < 1) {
    if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_00360f8a;
  }
  else {
    lVar9 = 8;
    lVar8 = 0;
    do {
      __ptr = *(void **)((long)&pVVar2->nCap + lVar9);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        pVVar2 = p_00->pArray;
        *(undefined8 *)((long)&pVVar2->nCap + lVar9) = 0;
        iVar6 = p_00->nCap;
      }
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar8 < iVar6);
  }
  free(pVVar2);
LAB_00360f8a:
  free(p_00);
  if (vNodeFrames->pArray != (int *)0x0) {
    free(vNodeFrames->pArray);
  }
  free(vNodeFrames);
  pVVar2 = local_38;
  pcVar5 = pWVar4->pInits;
  uVar10 = 0;
  do {
    cVar1 = *pcVar5;
    uVar7 = 1;
    if (cVar1 != 'x') {
      if (cVar1 == '\0') {
        printf("iFirstMemPi = %d  iFirstCi = %d  iFirstMemCi = %d  nDcBits = %d\n",
               (ulong)(uint)iFirstMemPi,(ulong)(uint)iFirstCi,(ulong)(uint)iFirstMemCi,uVar10);
        if (vMemObjs != (Vec_Int_t *)0x0) {
          if (vMemObjs->pArray != (int *)0x0) {
            free(vMemObjs->pArray);
          }
          free(vMemObjs);
        }
        if (pVVar2 != (Vec_Int_t *)0x0) {
          if (pVVar2->pArray != (int *)0x0) {
            free(pVVar2->pArray);
          }
          free(pVVar2);
        }
        return pWVar4;
      }
      uVar7 = (uint)(cVar1 == 'X');
    }
    uVar10 = (ulong)((int)uVar10 + uVar7);
    pcVar5 = pcVar5 + 1;
  } while( true );
}

Assistant:

Wlc_Ntk_t * Wlc_NtkMemAbstractTest( Wlc_Ntk_t * p )
{
    int iFirstMemPi, iFirstCi, iFirstMemCi, nDcBits;
    Vec_Int_t * vRefine;
    Vec_Int_t * vMemObjs    = Wlc_NtkCollectMemory( p, 0 );
    Vec_Int_t * vMemFanins  = Wlc_NtkCollectMemFanins( p, vMemObjs );

    Vec_Wec_t * vRefines    = Vec_WecAlloc( 100 );
    Vec_Int_t * vNodeFrames = Vec_IntAlloc( 100 );
    Wlc_Ntk_t * pNewFull;

    vRefine     = Vec_WecPushLevel(vRefines);
    Vec_IntPush( vRefine,  (11 << 11) | 0 );
    Vec_IntPush( vRefine,  (10 << 11) | 0 );
    Vec_IntPush( vRefine,  ( 8 << 11) | 0 );
    Vec_IntPush( vRefine,  ( 9 << 11) | 0 );
    Wlc_NtkAbsAddToNodeFrames( vNodeFrames, vRefine );

//    pNewFull    = Wlc_NtkAbstractMemory( p, vMemObjs, vMemFanins, &iFirstMemPi, &iFirstCi, &iFirstMemCi, NULL, NULL );
    pNewFull    = Wlc_NtkAbstractMemory( p, vMemObjs, NULL, &iFirstMemPi, &iFirstCi, &iFirstMemCi, vRefines, vNodeFrames );

    Vec_WecFree( vRefines );
    Vec_IntFree( vNodeFrames );

    nDcBits     = Wlc_CountDcs( pNewFull->pInits );
    printf( "iFirstMemPi = %d  iFirstCi = %d  iFirstMemCi = %d  nDcBits = %d\n", iFirstMemPi, iFirstCi, iFirstMemCi, nDcBits );

    Vec_IntFreeP( &vMemObjs );
    Vec_IntFreeP( &vMemFanins );
    return pNewFull;
}